

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O1

ASN1_STRING * ASN1_STRING_set_by_NID(ASN1_STRING **out,uchar *in,int inlen,int inform,int nid)

{
  int iVar1;
  ASN1_STRING_TABLE *pAVar2;
  ASN1_STRING *pAVar3;
  ulong mask;
  ASN1_STRING *str;
  ASN1_STRING *local_28;
  
  local_28 = (ASN1_STRING *)0x0;
  if (out == (ASN1_STRING **)0x0) {
    out = &local_28;
  }
  pAVar2 = asn1_string_table_get(nid);
  if (pAVar2 == (ASN1_STRING_TABLE *)0x0) {
    iVar1 = ASN1_mbstring_copy(out,in,inlen,inform,0x2000);
  }
  else {
    mask = (ulong)((uint)pAVar2->mask & 0x2000);
    if ((pAVar2->flags & 2) != 0) {
      mask = pAVar2->mask;
    }
    iVar1 = ASN1_mbstring_ncopy(out,in,inlen,inform,mask,pAVar2->minsize,pAVar2->maxsize);
  }
  if (iVar1 < 1) {
    pAVar3 = (ASN1_STRING *)0x0;
  }
  else {
    pAVar3 = *out;
  }
  return pAVar3;
}

Assistant:

ASN1_STRING *ASN1_STRING_set_by_NID(ASN1_STRING **out, const unsigned char *in,
                                    ossl_ssize_t len, int inform, int nid) {
  ASN1_STRING *str = NULL;
  int ret;
  if (!out) {
    out = &str;
  }
  const ASN1_STRING_TABLE *tbl = asn1_string_table_get(nid);
  if (tbl != NULL) {
    unsigned long mask = tbl->mask;
    if (!(tbl->flags & STABLE_NO_MASK)) {
      mask &= B_ASN1_UTF8STRING;
    }
    ret = ASN1_mbstring_ncopy(out, in, len, inform, mask, tbl->minsize,
                              tbl->maxsize);
  } else {
    ret = ASN1_mbstring_copy(out, in, len, inform, B_ASN1_UTF8STRING);
  }
  if (ret <= 0) {
    return NULL;
  }
  return *out;
}